

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdapimin.c
# Opt level: O1

int jpeg_read_header(j_decompress_ptr cinfo,boolean require_image)

{
  uint uVar1;
  jpeg_error_mgr *pjVar2;
  int iVar3;
  
  uVar1 = cinfo->global_state;
  if ((uVar1 & 0xfffffffe) != 200) {
    pjVar2 = cinfo->err;
    pjVar2->msg_code = 0x15;
    (pjVar2->msg_parm).i[0] = uVar1;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  iVar3 = jpeg_consume_input(cinfo);
  if (iVar3 == 2) {
    if (require_image != 0) {
      pjVar2 = cinfo->err;
      pjVar2->msg_code = 0x35;
      (*pjVar2->error_exit)((j_common_ptr)cinfo);
    }
    jpeg_abort((j_common_ptr)cinfo);
    iVar3 = 2;
  }
  return iVar3;
}

Assistant:

GLOBAL(int)
jpeg_read_header (j_decompress_ptr cinfo, boolean require_image)
{
  int retcode;

  if (cinfo->global_state != DSTATE_START &&
      cinfo->global_state != DSTATE_INHEADER)
    ERREXIT1(cinfo, JERR_BAD_STATE, cinfo->global_state);

  retcode = jpeg_consume_input(cinfo);

  switch (retcode) {
  case JPEG_REACHED_SOS:
    retcode = JPEG_HEADER_OK;
    break;
  case JPEG_REACHED_EOI:
    if (require_image)		/* Complain if application wanted an image */
      ERREXIT(cinfo, JERR_NO_IMAGE);
    /* Reset to start state; it would be safer to require the application to
     * call jpeg_abort, but we can't change it now for compatibility reasons.
     * A side effect is to free any temporary memory (there shouldn't be any).
     */
    jpeg_abort((j_common_ptr) cinfo); /* sets state = DSTATE_START */
    retcode = JPEG_HEADER_TABLES_ONLY;
    break;
  case JPEG_SUSPENDED:
    /* no work */
    break;
  }

  return retcode;
}